

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O1

ON_ClippingPlaneData * __thiscall
ON_ClippingPlaneDataList::FromSerialNumber(ON_ClippingPlaneDataList *this,uint sn)

{
  ON_ClippingPlaneData *pOVar1;
  bool bVar2;
  ON_ClippingPlaneData *in_RAX;
  long lVar3;
  long lVar4;
  
  if ((sn != 0) && (lVar3 = (long)(this->m_list).m_count, 0 < lVar3)) {
    lVar4 = 0;
    do {
      pOVar1 = (this->m_list).m_a[lVar4];
      if ((pOVar1 == (ON_ClippingPlaneData *)0x0) || (pOVar1->m_sn != sn)) {
        bVar2 = true;
      }
      else {
        bVar2 = false;
        in_RAX = pOVar1;
      }
      if (!bVar2) {
        return in_RAX;
      }
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
  }
  return (ON_ClippingPlaneData *)0x0;
}

Assistant:

ON_ClippingPlaneData* ON_ClippingPlaneDataList::FromSerialNumber(unsigned int sn)
{
  if (0==sn)
    return nullptr;
  
  // TODO: use binary search
  int count = m_list.Count();
  for (int i=0; i<count; i++)
  {
    ON_ClippingPlaneData* data = m_list[i];
    if (data && data->m_sn == sn)
      return data;
  }
  return nullptr;
}